

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16_regexp.cc
# Opt level: O0

RegExp * re2c::UTF16Symbol(rune r)

{
  uint32_t c;
  uint32_t c_00;
  Range *pRVar1;
  MatchOp *this;
  MatchOp *this_00;
  uint32_t tr;
  uint32_t ld;
  CatOp *pCStack_10;
  rune r_local;
  
  if (r < 0x10000) {
    pCStack_10 = (CatOp *)operator_new(0x10);
    pRVar1 = Range::sym(r);
    MatchOp::MatchOp((MatchOp *)pCStack_10,pRVar1);
  }
  else {
    c = utf16::lead_surr(r);
    c_00 = utf16::trail_surr(r);
    pCStack_10 = (CatOp *)operator_new(0x18);
    this = (MatchOp *)operator_new(0x10);
    pRVar1 = Range::sym(c);
    MatchOp::MatchOp(this,pRVar1);
    this_00 = (MatchOp *)operator_new(0x10);
    pRVar1 = Range::sym(c_00);
    MatchOp::MatchOp(this_00,pRVar1);
    CatOp::CatOp(pCStack_10,(RegExp *)this,(RegExp *)this_00);
  }
  return &pCStack_10->super_RegExp;
}

Assistant:

RegExp * UTF16Symbol(utf16::rune r)
{
	if (r <= utf16::MAX_1WORD_RUNE)
		return new MatchOp(Range::sym (r));
	else
	{
		const uint32_t ld = utf16::lead_surr(r);
		const uint32_t tr = utf16::trail_surr(r);
		return new CatOp(new MatchOp(Range::sym (ld)), new MatchOp(Range::sym (tr)));
	}
}